

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Polynomial.hpp
# Opt level: O2

Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *
Kernel::Monom<Kernel::NumTraits<Kernel::RationalConstantType>_>::zero(void)

{
  int iVar1;
  Monom<Kernel::NumTraits<Kernel::RationalConstantType>_> *in_RDI;
  Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_> SStack_58;
  Perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>,_Lib::PerfectIdComparison>
  local_38;
  RationalConstantType local_28;
  
  if (Monom<Kernel::NumTraits<Kernel::RationalConstantType>>::zero()::p == '\0') {
    iVar1 = __cxa_guard_acquire(&Monom<Kernel::NumTraits<Kernel::RationalConstantType>>::zero()::p);
    if (iVar1 != 0) {
      RationalConstantType::RationalConstantType(&local_28,0);
      MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_>::MonomFactors
                ((MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *)&SStack_58);
      Lib::
      perfect<Kernel::MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>>,Lib::PerfectIdComparison>
                ((Lib *)&local_38,
                 (MonomFactors<Kernel::NumTraits<Kernel::RationalConstantType>_> *)&SStack_58);
      Monom(&zero::p,&local_28,&local_38);
      Lib::Stack<Kernel::MonomFactor<Kernel::NumTraits<Kernel::RationalConstantType>_>_>::~Stack
                (&SStack_58);
      RationalConstantType::~RationalConstantType(&local_28);
      __cxa_atexit(~Monom,&zero::p,&__dso_handle);
      __cxa_guard_release(&Monom<Kernel::NumTraits<Kernel::RationalConstantType>>::zero()::p);
    }
  }
  Monom(in_RDI,&zero::p);
  return in_RDI;
}

Assistant:

Monom<Number> Monom<Number>::zero() 
{ 
  static Monom p = Monom(Numeral(0), perfect(MonomFactors<Number>()));
  ASS(p.isZeroConst()) 
  return p; 
}